

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QModelIndex>::reserve(QList<QModelIndex> *this,qsizetype asize)

{
  bool bVar1;
  QArrayDataPointer<QModelIndex> *this_00;
  qsizetype qVar2;
  QModelIndex *e;
  QModelIndex *b;
  Data *pDVar3;
  long in_RSI;
  QArrayDataPointer<QModelIndex> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QModelIndex> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QModelIndex> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QModelIndex> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<QModelIndex> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QModelIndex> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<QModelIndex> *)capacity((QList<QModelIndex> *)0x7ff60f);
  qVar2 = QArrayDataPointer<QModelIndex>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)this_00 - qVar2) {
    QArrayDataPointer<QModelIndex>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QModelIndex>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_007ff7b3;
    QArrayDataPointer<QModelIndex>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QModelIndex>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QModelIndex>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QModelIndex>::setFlag
                ((QArrayDataPointer<QModelIndex> *)0x7ff6b7,(ArrayOptions)f.i);
      goto LAB_007ff7b3;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QModelIndex> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QModelIndex>::QArrayDataPointer
            (this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  e = (QModelIndex *)QArrayDataPointer<QModelIndex>::operator->(&local_38);
  QArrayDataPointer<QModelIndex>::operator->(in_RDI);
  b = QArrayDataPointer<QModelIndex>::begin((QArrayDataPointer<QModelIndex> *)0x7ff737);
  QArrayDataPointer<QModelIndex>::operator->(in_RDI);
  QArrayDataPointer<QModelIndex>::end((QArrayDataPointer<QModelIndex> *)e);
  QtPrivate::QGenericArrayOps<QModelIndex>::copyAppend(in_stack_ffffffffffffff90,b,e);
  pDVar3 = QArrayDataPointer<QModelIndex>::d_ptr(&local_38);
  if (pDVar3 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QModelIndex> *)QArrayDataPointer<QModelIndex>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)e,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QModelIndex>::setFlag
              ((QArrayDataPointer<QModelIndex> *)0x7ff79a,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QModelIndex>::swap
            ((QArrayDataPointer<QModelIndex> *)e,in_stack_ffffffffffffff78);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)e);
LAB_007ff7b3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}